

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_dealloc_unittest.cc
# Opt level: O2

void AllocStuff(void)

{
  tuple<void_**,_std::default_delete<void_*[]>_> tVar1;
  void *pvVar2;
  int i;
  long lVar3;
  __uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_> local_20;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> objects;
  
  tVar1.super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
  super__Head_base<0UL,_void_**,_false>._M_head_impl =
       (_Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>)operator_new__(0x2000);
  local_20._M_t.super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
  super__Head_base<0UL,_void_**,_false>._M_head_impl =
       (tuple<void_**,_std::default_delete<void_*[]>_>)
       (tuple<void_**,_std::default_delete<void_*[]>_>)
       tVar1.super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
       super__Head_base<0UL,_void_**,_false>._M_head_impl;
  for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 1) {
    pvVar2 = malloc(0x400);
    *(void **)((long)tVar1.super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                     super__Head_base<0UL,_void_**,_false>._M_head_impl + lVar3 * 8) = pvVar2;
  }
  for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 1) {
    free(*(void **)((long)tVar1.super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                          super__Head_base<0UL,_void_**,_false>._M_head_impl + lVar3 * 8));
  }
  std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr
            ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)&local_20);
  return;
}

Assistant:

static void AllocStuff() {
  do_early_stuff();

  std::unique_ptr<void*[]> objects{new void*[kNumObjects]};

  for (int i = 0; i < kNumObjects; i++) {
    objects[i] = malloc(kObjectSize);
  }
  for (int i = 0; i < kNumObjects; i++) {
    free(objects[i]);
  }
}